

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O2

void __thiscall
solitaire::graphics::SDLGraphicsSystemTests_throwIfSDLCreateWindowFailedDuringWindowCreation_Test::
TestBody(SDLGraphicsSystemTests_throwIfSDLCreateWindowFailedDuringWindowCreation_Test *this)

{
  bool bVar1;
  TypedExpectation<int_(unsigned_int)> *this_00;
  TypedExpectation<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  *this_01;
  WrapperMock *pWVar2;
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  Action<int_(unsigned_int)> local_60;
  MatcherBase<unsigned_int> local_40;
  ReturnAction<int> local_28;
  
  pWVar2 = &((this->super_SDLGraphicsSystemTests).sdlMock.rawPointer)->super_WrapperMock;
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)&local_40,0x20);
  SDL::WrapperMock::gmock_init
            ((MockSpec<int_(unsigned_int)> *)local_80,pWVar2,(Matcher<unsigned_int> *)&local_40);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<int_(unsigned_int)>::InternalExpectedAt
                      ((MockSpec<int_(unsigned_int)> *)local_80,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x85,"*sdlMock","init(0x00000020u)");
  testing::internal::ReturnAction<int>::ReturnAction(&local_28,0);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<int_(unsigned_int)> *)(local_70 + 0x10),(ReturnAction *)&local_28);
  testing::internal::TypedExpectation<int_(unsigned_int)>::WillOnce
            (this_00,(Action<int_(unsigned_int)> *)(local_70 + 0x10));
  std::_Function_base::~_Function_base((_Function_base *)(local_70 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase
            ((MatcherBase<unsigned_int> *)(local_80 + 8));
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase(&local_40);
  this_01 = SDLGraphicsSystemTests::expectSDLCreateWindow
                      (&this->super_SDLGraphicsSystemTests,
                       (string *)(anonymous_namespace)::title_abi_cxx11_,0x280,0x348);
  pWVar2 = (WrapperMock *)local_80;
  testing::PolymorphicAction::operator_cast_to_Action
            ((Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
              *)pWVar2,(PolymorphicAction *)(local_70 + 0x10));
  testing::internal::
  TypedExpectation<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  ::WillOnce(this_01,(Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
                      *)pWVar2);
  std::_Function_base::~_Function_base((_Function_base *)local_80);
  local_80._0_8_ =
       SDL::WrapperMock::gmock_quit
                 ((MockSpec<void_()> *)(this->super_SDLGraphicsSystemTests).sdlMock.rawPointer,
                  pWVar2);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_()>::InternalExpectedAt
            ((MockSpec<void_()> *)local_80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x87,"*sdlMock","quit()");
  local_80._0_8_ = local_70;
  local_70._0_8_ = (VTable *)0x0;
  local_70._8_8_ = (void *)0x0;
  local_80._8_8_ = (_func_int **)0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    SDLGraphicsSystem::createWindow
              (&(this->super_SDLGraphicsSystemTests).system,
               (string *)(anonymous_namespace)::title_abi_cxx11_,0x280,0x348);
  }
  std::__cxx11::string::assign(local_80);
  testing::Message::Message((Message *)(local_70 + 0x10));
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_40,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x8c,(char *)local_80._0_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)(local_70 + 0x10))
  ;
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
  if ((pointer)local_60.fun_.super__Function_base._M_functor._M_unused._0_8_ != (pointer)0x0) {
    (**(code **)((long)*local_60.fun_.super__Function_base._M_functor._M_unused._M_object + 8))();
  }
  std::__cxx11::string::~string((string *)local_80);
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemTests, throwIfSDLCreateWindowFailedDuringWindowCreation) {
    EXPECT_CALL(*sdlMock, init(SDL_INIT_VIDEO)).WillOnce(Return(success));
    expectSDLCreateWindow(title, windowWidth, windowHeight).WillOnce(ReturnNull());
    EXPECT_CALL(*sdlMock, quit());

    EXPECT_THROW(
        system.createWindow(title, windowWidth, windowHeight),
        std::runtime_error
    );
}